

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

void rw::ps2::printDMA(InstanceData *inst)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = (uint *)inst->data;
LAB_00129018:
  do {
    uVar1 = *puVar3;
    uVar2 = uVar1 & 0x70000000;
    do {
      if (uVar2 == 0x60000000) {
        printf("RET %04x %08x\n\n",(ulong)(uVar1 & 0xffff),(ulong)puVar3[1]);
        return;
      }
      if (uVar2 == 0x30000000) {
        printf("REF %04x %08x\n",(ulong)(uVar1 & 0xffff),(ulong)puVar3[1]);
        puVar3 = puVar3 + 4;
        goto LAB_00129018;
      }
    } while (uVar2 != 0x10000000);
    printf("CNT %04x %08x\n",(ulong)(uVar1 & 0xffff),(ulong)puVar3[1]);
    puVar3 = (uint *)((long)puVar3 + (ulong)((uVar1 & 0xffff) << 4) + 0x10);
  } while( true );
}

Assistant:

void
printDMA(InstanceData *inst)
{
	uint32 *tag = (uint32*)inst->data;
	uint32 qwc;
	for(;;){
		qwc = tag[0]&0xFFFF;
		switch(tag[0]&0x70000000){
		case DMAcnt:
			printf("CNT %04x %08x\n", qwc, tag[1]);
			tag += (1+qwc)*4;
			break;

		case DMAref:
			printf("REF %04x %08x\n", qwc, tag[1]);
			tag += 4;
			break;

		case DMAret:
			printf("RET %04x %08x\n\n", qwc, tag[1]);
			return;
		}
	}
}